

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

void TTD::SnapShot::DoSnapshotCompare(SnapShot *snap1,SnapShot *snap2,TTDCompareMap *compareMap)

{
  TTD_LOG_PTR_ID TVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  SnapRootInfoEntry *pSVar8;
  SnapContext *snapCtx1;
  SnapContext *pSVar9;
  int *piVar10;
  bool local_371;
  bool local_351;
  bool local_331;
  SnapObject *local_260;
  SnapObject *obj2;
  SnapObject *obj1;
  FunctionBodyResolveInfo *fb2;
  FunctionBodyResolveInfo *fb1;
  uint64 feval2;
  uint64 feval1;
  uint64 fnew2;
  uint64 fnew1;
  uint64 fload2;
  uint64 fload1;
  ScriptFunctionScopeInfo *scope2;
  ScriptFunctionScopeInfo *scope1;
  SlotArrayInfo *sai2;
  SlotArrayInfo *sai1;
  uint local_1e8;
  uint32 comparedObjects;
  uint32 comparedScopes;
  uint32 comparedSlotArrays;
  TTD_PTR_ID ptrId2;
  TTD_PTR_ID ptrId1;
  undefined1 local_1c8 [4];
  TTDCompareTag ctag;
  Iterator iter2_2;
  undefined1 local_198 [3];
  bool match;
  PropertyId pid1;
  Iterator iter1_2;
  Iterator iter2_1;
  SnapContext *ctx2;
  SnapContext *ctx1;
  Iterator iter1_1;
  TTD_PTR_ID id1;
  SnapRootInfoEntry *pSStack_100;
  bool ll1;
  SnapRootInfoEntry *rootEntry2;
  Iterator iter2;
  SnapRootInfoEntry *rootEntry1;
  Iterator iter1;
  undefined1 local_90 [8];
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  allRootMap2;
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  allRootMap1;
  TTDCompareMap *compareMap_local;
  SnapShot *snap2_local;
  SnapShot *snap1_local;
  
  uVar5 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Count(&snap1->m_rootList)
  ;
  uVar6 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Count(&snap2->m_rootList)
  ;
  TTDCompareMap::DiagnosticAssert(compareMap,uVar5 == uVar6);
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&allRootMap2.stats,&Memory::HeapAllocator::Instance,0);
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)local_90,&Memory::HeapAllocator::Instance,0);
  UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::GetIterator
            ((Iterator *)&rootEntry1,&snap1->m_rootList);
  while (bVar4 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Iterator::IsValid
                           ((Iterator *)&rootEntry1), bVar4) {
    iter2.m_currEntry =
         UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Iterator::Current
                   ((Iterator *)&rootEntry1);
    JsUtil::
    BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&allRootMap2.stats,&(iter2.m_currEntry)->LogId,&iter2.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Iterator::MoveNext
              ((Iterator *)&rootEntry1);
  }
  UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::GetIterator
            ((Iterator *)&rootEntry2,&snap2->m_rootList);
  while (bVar4 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Iterator::IsValid
                           ((Iterator *)&rootEntry2), bVar4) {
    pSStack_100 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Iterator::Current
                            ((Iterator *)&rootEntry2);
    JsUtil::
    BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)local_90,&pSStack_100->LogId,&stack0xffffffffffffff00);
    pSVar8 = JsUtil::
             BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::Item((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&allRootMap2.stats,&pSStack_100->LogId);
    TTDCompareMap::DiagnosticAssert
              (compareMap,
               (pSVar8->MaybeLongLivedRoot & 1U) == (pSStack_100->MaybeLongLivedRoot & 1U));
    pSVar8 = JsUtil::
             BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::Item((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&allRootMap2.stats,&pSStack_100->LogId);
    iter1_1.m_currEntry = (SnapContext *)pSVar8->LogObject;
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Root
              (compareMap,(TTD_PTR_ID)iter1_1.m_currEntry,pSStack_100->LogObject,pSStack_100->LogId)
    ;
    UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Iterator::MoveNext
              ((Iterator *)&rootEntry2);
  }
  TTDCompareMap::DiagnosticAssert
            (compareMap,snap1->m_activeScriptContext == snap2->m_activeScriptContext);
  uVar5 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count(&snap1->m_ctxList);
  uVar6 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count(&snap2->m_ctxList);
  TTDCompareMap::DiagnosticAssert(compareMap,uVar5 == uVar6);
  UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::GetIterator
            ((Iterator *)&ctx1,&snap1->m_ctxList);
  do {
    bVar4 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::IsValid
                      ((Iterator *)&ctx1);
    if (!bVar4) {
      uVar5 = UnorderedArrayList<int,_32UL>::Count(&snap1->m_tcSymbolRegistrationMapContents);
      uVar6 = UnorderedArrayList<int,_32UL>::Count(&snap2->m_tcSymbolRegistrationMapContents);
      TTDCompareMap::DiagnosticAssert(compareMap,uVar5 == uVar6);
      UnorderedArrayList<int,_32UL>::GetIterator
                ((Iterator *)local_198,&snap1->m_tcSymbolRegistrationMapContents);
      do {
        bVar4 = UnorderedArrayList<int,_32UL>::Iterator::IsValid((Iterator *)local_198);
        if (!bVar4) {
          ptrId1._4_4_ = 0;
          ptrId2 = 0;
          _comparedScopes = 0;
          comparedObjects = 0;
          local_1e8 = 0;
          sai1._4_4_ = 0;
          TTDCompareMap::GetNextCompareInfo
                    (compareMap,(TTDCompareTag *)((long)&ptrId1 + 4),&ptrId2,
                     (TTD_PTR_ID *)&comparedScopes);
          do {
            uVar5 = comparedObjects;
            if (ptrId1._4_4_ == 0) {
              uVar7 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count
                                (&snap1->m_slotArrayEntries);
              uVar6 = comparedObjects;
              local_331 = false;
              if (uVar5 <= uVar7) {
                uVar5 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count
                                  (&snap2->m_slotArrayEntries);
                local_331 = uVar6 <= uVar5;
              }
              TTDCompareMap::DiagnosticAssert(compareMap,local_331);
              uVar2 = local_1e8;
              uVar5 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count
                                (&snap1->m_scopeEntries);
              uVar3 = local_1e8;
              local_351 = false;
              if (uVar2 <= uVar5) {
                uVar5 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::
                        Count(&snap2->m_scopeEntries);
                local_351 = uVar3 <= uVar5;
              }
              TTDCompareMap::DiagnosticAssert(compareMap,local_351);
              uVar2 = sai1._4_4_;
              uVar5 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                                (&snap1->m_compoundObjectList);
              uVar3 = sai1._4_4_;
              local_371 = false;
              if (uVar2 <= uVar5) {
                uVar5 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                                  (&snap2->m_compoundObjectList);
                local_371 = uVar3 <= uVar5;
              }
              TTDCompareMap::DiagnosticAssert(compareMap,local_371);
              uVar5 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count
                                (&snap1->m_slotArrayEntries);
              uVar6 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count
                                (&snap2->m_slotArrayEntries);
              TTDCompareMap::DiagnosticAssert(compareMap,uVar5 == uVar6);
              uVar5 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count
                                (&snap1->m_scopeEntries);
              uVar6 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count
                                (&snap2->m_scopeEntries);
              TTDCompareMap::DiagnosticAssert(compareMap,uVar5 == uVar6);
              uVar5 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                                (&snap1->m_compoundObjectList);
              uVar6 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                                (&snap2->m_compoundObjectList);
              TTDCompareMap::DiagnosticAssert(compareMap,uVar5 == uVar6);
              JsUtil::
              BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::~BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                 *)local_90);
              JsUtil::
              BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::~BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                 *)&allRootMap2.stats);
              return;
            }
            if (ptrId1._4_4_ == 1) {
              sai2 = (SlotArrayInfo *)0x0;
              scope1 = (ScriptFunctionScopeInfo *)0x0;
              TTDCompareMap::GetCompareValues
                        (compareMap,SlotArray,ptrId2,&sai2,_comparedScopes,(SlotArrayInfo **)&scope1
                        );
              NSSnapValues::AssertSnapEquiv(sai2,(SlotArrayInfo *)scope1,compareMap);
              comparedObjects = comparedObjects + 1;
            }
            else if (ptrId1._4_4_ == 2) {
              scope2 = (ScriptFunctionScopeInfo *)0x0;
              fload1 = 0;
              TTDCompareMap::GetCompareValues
                        (compareMap,FunctionScopeInfo,ptrId2,&scope2,_comparedScopes,
                         (ScriptFunctionScopeInfo **)&fload1);
              NSSnapValues::AssertSnapEquiv(scope2,(ScriptFunctionScopeInfo *)fload1,compareMap);
              local_1e8 = local_1e8 + 1;
            }
            else if (ptrId1._4_4_ == 3) {
              fload2 = 0;
              fnew1 = 0;
              TTDCompareMap::GetCompareValues
                        (compareMap,TopLevelLoadFunction,ptrId2,&fload2,_comparedScopes,&fnew1);
              TTDCompareMap::DiagnosticAssert(compareMap,fload2 == fnew1);
            }
            else if (ptrId1._4_4_ == 4) {
              fnew2 = 0;
              feval1 = 0;
              TTDCompareMap::GetCompareValues
                        (compareMap,TopLevelNewFunction,ptrId2,&fnew2,_comparedScopes,&feval1);
              TTDCompareMap::DiagnosticAssert(compareMap,fnew2 == feval1);
            }
            else if (ptrId1._4_4_ == 5) {
              feval2 = 0;
              fb1 = (FunctionBodyResolveInfo *)0x0;
              TTDCompareMap::GetCompareValues
                        (compareMap,TopLevelEvalFunction,ptrId2,&feval2,_comparedScopes,
                         (uint64 *)&fb1);
              TTDCompareMap::DiagnosticAssert(compareMap,(FunctionBodyResolveInfo *)feval2 == fb1);
            }
            else if (ptrId1._4_4_ == 6) {
              fb2 = (FunctionBodyResolveInfo *)0x0;
              obj1 = (SnapObject *)0x0;
              TTDCompareMap::GetCompareValues
                        (compareMap,FunctionBody,ptrId2,&fb2,_comparedScopes,
                         (FunctionBodyResolveInfo **)&obj1);
              NSSnapValues::AssertSnapEquiv(fb2,(FunctionBodyResolveInfo *)obj1,compareMap);
            }
            else {
              if (ptrId1._4_4_ != 7) {
                TTDAbort_unrecoverable_error("Missing tag in case list!!!");
              }
              obj2 = (SnapObject *)0x0;
              local_260 = (SnapObject *)0x0;
              TTDCompareMap::GetCompareValues
                        (compareMap,SnapObject,ptrId2,&obj2,_comparedScopes,&local_260);
              NSSnapObjects::AssertSnapEquiv(obj2,local_260,compareMap);
              sai1._4_4_ = sai1._4_4_ + 1;
            }
            TTDCompareMap::GetNextCompareInfo
                      (compareMap,(TTDCompareTag *)((long)&ptrId1 + 4),&ptrId2,
                       (TTD_PTR_ID *)&comparedScopes);
          } while( true );
        }
        piVar10 = UnorderedArrayList<int,_32UL>::Iterator::Current((Iterator *)local_198);
        iter2_2.m_currEntry._4_4_ = *piVar10;
        iter2_2.m_currEntry._3_1_ = 0;
        UnorderedArrayList<int,_32UL>::GetIterator
                  ((Iterator *)local_1c8,&snap2->m_tcSymbolRegistrationMapContents);
        while (bVar4 = UnorderedArrayList<int,_32UL>::Iterator::IsValid((Iterator *)local_1c8),
              bVar4) {
          piVar10 = UnorderedArrayList<int,_32UL>::Iterator::Current((Iterator *)local_1c8);
          if (*piVar10 == iter2_2.m_currEntry._4_4_) {
            iter2_2.m_currEntry._3_1_ = 1;
            break;
          }
          UnorderedArrayList<int,_32UL>::Iterator::MoveNext((Iterator *)local_1c8);
        }
        TTDCompareMap::DiagnosticAssert(compareMap,(bool)(iter2_2.m_currEntry._3_1_ & 1));
        UnorderedArrayList<int,_32UL>::Iterator::MoveNext((Iterator *)local_198);
      } while( true );
    }
    snapCtx1 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::Current
                         ((Iterator *)&ctx1);
    iter2_1.m_currEntry = (SnapContext *)0x0;
    UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::GetIterator
              ((Iterator *)&iter1_2.m_currEntry,&snap2->m_ctxList);
    while (bVar4 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::IsValid
                             ((Iterator *)&iter1_2.m_currEntry), bVar4) {
      TVar1 = snapCtx1->ScriptContextLogId;
      pSVar9 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::Current
                         ((Iterator *)&iter1_2.m_currEntry);
      if (TVar1 == pSVar9->ScriptContextLogId) {
        iter2_1.m_currEntry =
             UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::Current
                       ((Iterator *)&iter1_2.m_currEntry);
        break;
      }
      UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::MoveNext
                ((Iterator *)&iter1_2.m_currEntry);
    }
    TTDCompareMap::DiagnosticAssert(compareMap,iter2_1.m_currEntry != (SnapContext *)0x0);
    NSSnapValues::AssertSnapEquiv
              (snapCtx1,iter2_1.m_currEntry,
               (BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)&allRootMap2.stats,
               (BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)local_90,compareMap);
    UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::MoveNext((Iterator *)&ctx1);
  } while( true );
}

Assistant:

void SnapShot::DoSnapshotCompare(const SnapShot* snap1, const SnapShot* snap2, TTDCompareMap& compareMap)
    {
        //compare the roots to kick things off
        compareMap.DiagnosticAssert(snap1->m_rootList.Count() == snap2->m_rootList.Count());

        JsUtil::BaseDictionary<TTD_LOG_PTR_ID, NSSnapValues::SnapRootInfoEntry*, HeapAllocator> allRootMap1(&HeapAllocator::Instance);
        JsUtil::BaseDictionary<TTD_LOG_PTR_ID, NSSnapValues::SnapRootInfoEntry*, HeapAllocator> allRootMap2(&HeapAllocator::Instance);

        for(auto iter1 = snap1->m_rootList.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* rootEntry1 = iter1.Current();
            allRootMap1.AddNew(rootEntry1->LogId, rootEntry1);
        }

        for(auto iter2 = snap2->m_rootList.GetIterator(); iter2.IsValid(); iter2.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* rootEntry2 = iter2.Current();
            allRootMap2.AddNew(rootEntry2->LogId, rootEntry2);

            bool ll1 = allRootMap1.Item(rootEntry2->LogId)->MaybeLongLivedRoot;
            compareMap.DiagnosticAssert(ll1 == rootEntry2->MaybeLongLivedRoot);

            TTD_PTR_ID id1 = allRootMap1.Item(rootEntry2->LogId)->LogObject;
            compareMap.CheckConsistentAndAddPtrIdMapping_Root(id1, rootEntry2->LogObject, rootEntry2->LogId);
        }

        //Get the script contexts into the mix
        compareMap.DiagnosticAssert(snap1->m_activeScriptContext == snap2->m_activeScriptContext);
        compareMap.DiagnosticAssert(snap1->m_ctxList.Count() == snap2->m_ctxList.Count());
        for(auto iter1 = snap1->m_ctxList.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx1 = iter1.Current();
            const NSSnapValues::SnapContext* ctx2 = nullptr;
            for(auto iter2 = snap2->m_ctxList.GetIterator(); iter2.IsValid(); iter2.MoveNext())
            {
                if(ctx1->ScriptContextLogId == iter2.Current()->ScriptContextLogId)
                {
                    ctx2 = iter2.Current();
                    break;
                }
            }
            compareMap.DiagnosticAssert(ctx2 != nullptr);

            NSSnapValues::AssertSnapEquiv(ctx1, ctx2, allRootMap1, allRootMap2, compareMap);
        }

        //compare the contents of the two thread context symbol maps
        compareMap.DiagnosticAssert(snap1->m_tcSymbolRegistrationMapContents.Count() == snap2->m_tcSymbolRegistrationMapContents.Count());
        for(auto iter1 = snap1->m_tcSymbolRegistrationMapContents.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            const Js::PropertyId pid1 = *iter1.Current();
            bool match = false;
            for(auto iter2 = snap2->m_tcSymbolRegistrationMapContents.GetIterator(); iter2.IsValid(); iter2.MoveNext())
            {
                if(*iter2.Current() == pid1)
                {
                    match = true;
                    break;
                }
            }
            compareMap.DiagnosticAssert(match);
        }

        //Iterate on the worklist until we are done
        TTDCompareTag ctag = TTDCompareTag::Done;
        TTD_PTR_ID ptrId1 = TTD_INVALID_PTR_ID;
        TTD_PTR_ID ptrId2 = TTD_INVALID_PTR_ID;

        uint32 comparedSlotArrays = 0;
        uint32 comparedScopes = 0;
        uint32 comparedObjects = 0;

        compareMap.GetNextCompareInfo(&ctag, &ptrId1, &ptrId2);
        while(ctag != TTDCompareTag::Done)
        {
            if(ctag == TTDCompareTag::SlotArray)
            {
                const NSSnapValues::SlotArrayInfo* sai1 = nullptr;
                const NSSnapValues::SlotArrayInfo* sai2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &sai1, ptrId2, &sai2);
                NSSnapValues::AssertSnapEquiv(sai1, sai2, compareMap);

                comparedSlotArrays++;
            }
            else if(ctag == TTDCompareTag::FunctionScopeInfo)
            {
                const NSSnapValues::ScriptFunctionScopeInfo* scope1 = nullptr;
                const NSSnapValues::ScriptFunctionScopeInfo* scope2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &scope1, ptrId2, &scope2);
                NSSnapValues::AssertSnapEquiv(scope1, scope2, compareMap);

                comparedScopes++;
            }
            else if(ctag == TTDCompareTag::TopLevelLoadFunction)
            {
                uint64 fload1 = 0;
                uint64 fload2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &fload1, ptrId2, &fload2);
                compareMap.DiagnosticAssert(fload1 == fload2);
            }
            else if(ctag == TTDCompareTag::TopLevelNewFunction)
            {
                uint64 fnew1 = 0;
                uint64 fnew2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &fnew1, ptrId2, &fnew2);
                compareMap.DiagnosticAssert(fnew1 == fnew2);
            }
            else if(ctag == TTDCompareTag::TopLevelEvalFunction)
            {
                uint64 feval1 = 0;
                uint64 feval2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &feval1, ptrId2, &feval2);
                compareMap.DiagnosticAssert(feval1 == feval2);
            }
            else if(ctag == TTDCompareTag::FunctionBody)
            {
                const NSSnapValues::FunctionBodyResolveInfo* fb1 = nullptr;
                const NSSnapValues::FunctionBodyResolveInfo* fb2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &fb1, ptrId2, &fb2);
                NSSnapValues::AssertSnapEquiv(fb1, fb2, compareMap);
            }
            else if(ctag == TTDCompareTag::SnapObject)
            {
                const NSSnapObjects::SnapObject* obj1 = nullptr;
                const NSSnapObjects::SnapObject* obj2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &obj1, ptrId2, &obj2);
                NSSnapObjects::AssertSnapEquiv(obj1, obj2, compareMap);

                comparedObjects++;
            }
            else
            {
                TTDAssert(false, "Missing tag in case list!!!");
            }

            compareMap.GetNextCompareInfo(&ctag, &ptrId1, &ptrId2);
        }

        //Make sure all objects/values have been matched -- well not quite since we don't align and treaverse WeakSet values we might not compare everything -- maybe improve later?
        compareMap.DiagnosticAssert(comparedSlotArrays <= snap1->m_slotArrayEntries.Count() && comparedSlotArrays <= snap2->m_slotArrayEntries.Count());
        compareMap.DiagnosticAssert(comparedScopes <= snap1->m_scopeEntries.Count() && comparedScopes <= snap2->m_scopeEntries.Count());
        compareMap.DiagnosticAssert(comparedObjects <= snap1->m_compoundObjectList.Count() && comparedObjects <= snap2->m_compoundObjectList.Count());

        compareMap.DiagnosticAssert(snap1->m_slotArrayEntries.Count() == snap2->m_slotArrayEntries.Count());
        compareMap.DiagnosticAssert(snap1->m_scopeEntries.Count() == snap2->m_scopeEntries.Count());
        compareMap.DiagnosticAssert(snap1->m_compoundObjectList.Count() == snap2->m_compoundObjectList.Count());

        //
        //TODO: if we missed something we may want to put code here to identify it
        //
    }